

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::enqueue_event<afsm::test::events::commit>
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,commit *event)

{
  mutex_type *__mutex;
  test_fsm_observer *this_00;
  int iVar1;
  undefined8 uVar2;
  id_type *local_30;
  anon_class_16_2_20c42392 local_28;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    LOCK();
    (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
         (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    this_00 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
              super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (test_fsm_observer *)0x0) {
      test::test_fsm_observer::
      enqueue_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::commit>
                (this_00,this,event);
    }
    local_30 = (id_type *)&detail::event<afsm::test::events::commit>::id;
    local_28.this = this;
    std::
    deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
    ::
    emplace_back<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::enqueue_event<afsm::test::events::commit>(afsm::test::events::commit&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
              ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
                *)&this->queued_events_,&local_28,&local_30);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    process_event_queue(this);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void
    enqueue_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace_back([&, evt]() mutable {
                return process_event_dispatch(::std::move(evt));
            }, &evt_identity::id);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }